

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

uint * Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *p,Kit_DsdNtk_t *pNtk,int Id,uint uSupp)

{
  long *plVar1;
  ushort uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  uint *puVar8;
  uint *puVar9;
  uint uVar10;
  Kit_DsdObj_t KVar11;
  ulong uVar12;
  ushort uVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  Kit_DsdObj_t *pKVar17;
  long lVar18;
  ulong uVar19;
  bool bVar20;
  uint *pTruthFans [16];
  uint *local_b8;
  long local_b0 [16];
  
  if (-1 < Id) {
    uVar13 = pNtk->nVars;
    uVar10 = (uint)pNtk->nNodes + (uint)uVar13;
    if (Id < (int)uVar10) {
      if (Id < (int)(uint)uVar13) {
        pKVar17 = (Kit_DsdObj_t *)0x0;
      }
      else {
        pKVar17 = pNtk->pNodes[(long)Id - (ulong)uVar13];
      }
      if (p->vTtNodes->nSize <= Id) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar8 = (uint *)p->vTtNodes->pArray[(uint)Id];
      if (pKVar17 == (Kit_DsdObj_t *)0x0) {
        if ((int)(uint)uVar13 <= Id) {
          __assert_fail("Id < pNtk->nVars",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                        ,0x2c1,
                        "unsigned int *Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int)"
                       );
        }
        if ((uSupp != 0) && ((uSupp >> (Id & 0x1fU) & 1) == 0)) {
          __assert_fail("!uSupp || uSupp != (uSupp & ~(1<<Id))",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                        ,0x2c2,
                        "unsigned int *Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int)"
                       );
        }
      }
      else {
        KVar11 = *pKVar17;
        uVar15 = (uint)KVar11 >> 6 & 7;
        if (uVar15 == 2) {
          if (((uint)KVar11 & 0xfc000000) != 0x4000000) {
            __assert_fail("pObj->nFans == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                          ,0x2d1,
                          "unsigned int *Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int)"
                         );
          }
          uVar2 = *(ushort *)(pKVar17 + 1);
          uVar15 = (uint)(uVar2 >> 1);
          if (uVar10 <= uVar15) {
            __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kit.h"
                          ,0x9b,"int Kit_DsdLitIsLeaf(Kit_DsdNtk_t *, int)");
          }
          if (uVar13 <= uVar15) {
            __assert_fail("Kit_DsdLitIsLeaf( pNtk, iLit )",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                          ,0x2d3,
                          "unsigned int *Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int)"
                         );
          }
          puVar9 = Kit_DsdTruthComputeNodeOne_rec(p,pNtk,uVar15,uSupp);
          uVar3 = pNtk->nVars;
          uVar19 = (ulong)(uint)(1 << ((char)uVar3 - 5U & 0x1f));
          if ((ushort)uVar3 < 6) {
            uVar19 = 1;
          }
          if ((uVar2 & 1) == 0) {
            if (0 < (int)uVar19) {
              lVar18 = uVar19 + 1;
              do {
                puVar8[lVar18 + -2] = puVar9[lVar18 + -2];
                lVar18 = lVar18 + -1;
              } while (1 < lVar18);
            }
          }
          else if (0 < (int)uVar19) {
            lVar18 = uVar19 + 1;
            do {
              puVar8[lVar18 + -2] = ~puVar9[lVar18 + -2];
              lVar18 = lVar18 + -1;
            } while (1 < lVar18);
          }
        }
        else if (uVar15 == 1) {
          if (0x3ffffff < (uint)KVar11) {
            __assert_fail("pObj->nFans == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                          ,0x2c9,
                          "unsigned int *Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int)"
                         );
          }
          uVar10 = 1 << ((char)uVar13 - 5U & 0x1f);
          if (uVar13 < 6) {
            uVar10 = 1;
          }
          if (0 < (int)uVar10) {
            puVar8 = (uint *)memset(puVar8,0xff,(ulong)uVar10 << 2);
            return puVar8;
          }
        }
        else {
          if (uSupp == 0) {
            if ((uint)*pKVar17 < 0x4000000) {
              bVar20 = false;
            }
            else {
              uVar19 = 0;
              do {
                bVar20 = false;
                puVar9 = Kit_DsdTruthComputeNodeOne_rec
                                   (p,pNtk,(uint)(*(ushort *)
                                                   ((long)&pKVar17[1].field_0x0 + uVar19 * 2) >> 1),
                                    0);
                local_b0[uVar19 - 1] = (long)puVar9;
                uVar19 = uVar19 + 1;
              } while (uVar19 < (uint)*pKVar17 >> 0x1a);
            }
          }
          else {
            bVar20 = false;
            if (0x3ffffff < (uint)*pKVar17) {
              uVar19 = 0;
              do {
                uVar2 = *(ushort *)((long)&pKVar17[1].field_0x0 + uVar19 * 2) >> 1;
                uVar10 = (uint)uVar2;
                uVar13 = pNtk->nVars;
                if ((uint)pNtk->nNodes + (uint)uVar13 <= uVar10) {
                  __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kit.h"
                                ,0x9c,"unsigned int Kit_DsdLitSupport(Kit_DsdNtk_t *, int)");
                }
                if (pNtk->pSupps == (uint *)0x0) {
                  uVar15 = 0;
                }
                else if (uVar2 < uVar13) {
                  uVar15 = 1 << ((byte)uVar2 & 0x1f);
                }
                else {
                  uVar15 = pNtk->pSupps[(ulong)uVar10 - (ulong)uVar13];
                }
                if ((uVar15 & uSupp) == 0) {
                  bVar20 = true;
                  puVar9 = (uint *)0x0;
                }
                else {
                  puVar9 = Kit_DsdTruthComputeNodeOne_rec(p,pNtk,uVar10,uSupp);
                }
                local_b0[uVar19 - 1] = (long)puVar9;
                uVar19 = uVar19 + 1;
              } while (uVar19 < (uint)*pKVar17 >> 0x1a);
            }
          }
          KVar11 = *pKVar17;
          uVar10 = (uint)KVar11 >> 6 & 7;
          if (uVar10 == 5) {
            if (bVar20) {
              bVar20 = 0x3ffffff < (uint)KVar11;
              if (bVar20) {
                if (local_b8 == (uint *)0x0) {
                  uVar19 = 0;
                  do {
                    if ((ulong)((uint)KVar11 >> 0x1a) - 1 == uVar19) goto LAB_00551cd1;
                    uVar12 = uVar19 + 1;
                    plVar1 = local_b0 + uVar19;
                    uVar19 = uVar12;
                  } while (*plVar1 == 0);
                  bVar20 = uVar12 < (uint)KVar11 >> 0x1a;
                }
                else {
                  uVar12 = 0;
                }
                if (bVar20) {
                  return (uint *)local_b0[uVar12 - 1];
                }
              }
LAB_00551cd1:
              __assert_fail("i < pObj->nFans",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                            ,0x310,
                            "unsigned int *Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int)"
                           );
            }
            KVar11 = *pKVar17;
            if ((uint)KVar11 < 0x4000000) {
              uVar10 = (uint)KVar11 >> 0x1a;
            }
            else {
              uVar19 = 0;
              do {
                if ((*(byte *)((long)&pKVar17[1].field_0x0 + uVar19 * 2) & 1) != 0) {
                  uVar6 = pNtk->nVars;
                  uVar10 = 1 << ((char)uVar6 - 5U & 0x1f);
                  if ((ushort)uVar6 < 6) {
                    uVar10 = 1;
                  }
                  if (0 < (int)uVar10) {
                    lVar18 = local_b0[uVar19 - 1];
                    lVar16 = (ulong)uVar10 + 1;
                    do {
                      puVar9 = (uint *)(lVar18 + -8 + lVar16 * 4);
                      *puVar9 = ~*puVar9;
                      lVar16 = lVar16 + -1;
                    } while (1 < lVar16);
                  }
                }
                uVar19 = uVar19 + 1;
                KVar11 = *pKVar17;
                uVar10 = (uint)KVar11 >> 0x1a;
              } while (uVar19 < uVar10);
            }
            puVar9 = (uint *)0x0;
            if (((uint)KVar11 & 0x1c0) == 0x140) {
              puVar9 = (uint *)((long)&pKVar17[1].field_0x0 + (ulong)((uint)KVar11 >> 8 & 0x3fc));
            }
            puVar9 = Kit_TruthCompose(p->dd,puVar9,uVar10,&local_b8,(uint)pNtk->nVars,p->vTtBdds,
                                      p->vNodes);
            uVar7 = pNtk->nVars;
            uVar10 = 1 << ((char)uVar7 - 5U & 0x1f);
            if ((ushort)uVar7 < 6) {
              uVar10 = 1;
            }
            if (0 < (int)uVar10) {
              lVar18 = (ulong)uVar10 + 1;
              do {
                puVar8[lVar18 + -2] = puVar9[lVar18 + -2];
                lVar18 = lVar18 + -1;
              } while (1 < lVar18);
            }
          }
          else if (uVar10 == 4) {
            uVar5 = pNtk->nVars;
            uVar10 = 1 << ((char)uVar5 - 5U & 0x1f);
            if ((ushort)uVar5 < 6) {
              uVar10 = 1;
            }
            uVar19 = (ulong)uVar10;
            if (0 < (int)uVar10) {
              memset(puVar8,0,uVar19 * 4);
            }
            bVar20 = true;
            if (0x3ffffff < (uint)*pKVar17) {
              uVar12 = 0;
              uVar13 = 0;
              do {
                lVar18 = local_b0[uVar12 - 1];
                if (lVar18 != 0) {
                  uVar2 = *(ushort *)((long)&pKVar17[1].field_0x0 + uVar12 * 2);
                  lVar16 = uVar19 + 1;
                  if (0 < (int)uVar10) {
                    do {
                      puVar8[lVar16 + -2] =
                           puVar8[lVar16 + -2] ^ *(uint *)(lVar18 + -8 + lVar16 * 4);
                      lVar16 = lVar16 + -1;
                    } while (1 < lVar16);
                  }
                  uVar13 = uVar13 ^ uVar2 & 1;
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 < (uint)*pKVar17 >> 0x1a);
              bVar20 = uVar13 == 0;
            }
            if ((0 < (int)uVar10) && (!bVar20)) {
              lVar18 = uVar19 + 1;
              do {
                puVar8[lVar18 + -2] = ~puVar8[lVar18 + -2];
                lVar18 = lVar18 + -1;
              } while (1 < lVar18);
            }
          }
          else {
            if (uVar10 != 3) {
              __assert_fail("pObj->Type == KIT_DSD_PRIME",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                            ,0x308,
                            "unsigned int *Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int)"
                           );
            }
            uVar4 = pNtk->nVars;
            uVar10 = 1 << ((char)uVar4 - 5U & 0x1f);
            if ((ushort)uVar4 < 6) {
              uVar10 = 1;
            }
            if (0 < (int)uVar10) {
              memset(puVar8,0xff,(ulong)uVar10 * 4);
            }
            if (0x3ffffff < (uint)*pKVar17) {
              lVar18 = (ulong)uVar10 + 1;
              uVar19 = 0;
              do {
                lVar16 = local_b0[uVar19 - 1];
                if (lVar16 != 0) {
                  if ((*(byte *)((long)&pKVar17[1].field_0x0 + uVar19 * 2) & 1) == 0) {
                    lVar14 = lVar18;
                    if (0 < (int)uVar10) {
                      do {
                        puVar8[lVar14 + -2] =
                             puVar8[lVar14 + -2] & *(uint *)(lVar16 + -8 + lVar14 * 4);
                        lVar14 = lVar14 + -1;
                      } while (1 < lVar14);
                    }
                  }
                  else {
                    lVar14 = lVar18;
                    if (0 < (int)uVar10) {
                      do {
                        puVar8[lVar14 + -2] =
                             puVar8[lVar14 + -2] & ~*(uint *)(lVar16 + -8 + lVar14 * 4);
                        lVar14 = lVar14 + -1;
                      } while (1 < lVar14);
                    }
                  }
                }
                uVar19 = uVar19 + 1;
              } while (uVar19 < (uint)*pKVar17 >> 0x1a);
            }
          }
        }
      }
      return puVar8;
    }
  }
  __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kit.h"
                ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
}

Assistant:

unsigned * Kit_DsdTruthComputeNodeOne_rec( Kit_DsdMan_t * p, Kit_DsdNtk_t * pNtk, int Id, unsigned uSupp )
{
    Kit_DsdObj_t * pObj;
    unsigned * pTruthRes, * pTruthFans[16], * pTruthTemp;
    unsigned i, iLit, fCompl, nPartial = 0;
//    unsigned m, nMints, * pTruthPrime, * pTruthMint; 

    // get the node with this ID
    pObj = Kit_DsdNtkObj( pNtk, Id );
    pTruthRes = (unsigned *)Vec_PtrEntry( p->vTtNodes, Id );

    // special case: literal of an internal node
    if ( pObj == NULL )
    {
        assert( Id < pNtk->nVars );
        assert( !uSupp || uSupp != (uSupp & ~(1<<Id)) );
        return pTruthRes;
    }

    // constant node
    if ( pObj->Type == KIT_DSD_CONST1 )
    {
        assert( pObj->nFans == 0 );
        Kit_TruthFill( pTruthRes, pNtk->nVars );
        return pTruthRes;
    }

    // elementary variable node
    if ( pObj->Type == KIT_DSD_VAR )
    {
        assert( pObj->nFans == 1 );
        iLit = pObj->pFans[0];
        assert( Kit_DsdLitIsLeaf( pNtk, iLit ) );
        pTruthFans[0] = Kit_DsdTruthComputeNodeOne_rec( p, pNtk, Abc_Lit2Var(iLit), uSupp );
        if ( Abc_LitIsCompl(iLit) )
            Kit_TruthNot( pTruthRes, pTruthFans[0], pNtk->nVars );
        else
            Kit_TruthCopy( pTruthRes, pTruthFans[0], pNtk->nVars );
        return pTruthRes;
    }

    // collect the truth tables of the fanins
    if ( uSupp )
    {
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            if ( uSupp != (uSupp & ~Kit_DsdLitSupport(pNtk, iLit)) )
                pTruthFans[i] = Kit_DsdTruthComputeNodeOne_rec( p, pNtk, Abc_Lit2Var(iLit), uSupp );
            else
            {
                pTruthFans[i] = NULL;
                nPartial = 1;
            }
    }
    else
    {
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            pTruthFans[i] = Kit_DsdTruthComputeNodeOne_rec( p, pNtk, Abc_Lit2Var(iLit), uSupp );
    }
    // create the truth table

    // simple gates
    if ( pObj->Type == KIT_DSD_AND )
    {
        Kit_TruthFill( pTruthRes, pNtk->nVars );
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            if ( pTruthFans[i] )
                Kit_TruthAndPhase( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars, 0, Abc_LitIsCompl(iLit) );
        return pTruthRes;
    }
    if ( pObj->Type == KIT_DSD_XOR )
    {
        Kit_TruthClear( pTruthRes, pNtk->nVars );
        fCompl = 0;
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        {
            if ( pTruthFans[i] )
            {
                Kit_TruthXor( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars );
                fCompl ^= Abc_LitIsCompl(iLit);
            }
        }
        if ( fCompl )
            Kit_TruthNot( pTruthRes, pTruthRes, pNtk->nVars );
        return pTruthRes;
    }
    assert( pObj->Type == KIT_DSD_PRIME );

    if ( uSupp && nPartial )
    {
        // find the only non-empty component
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            if ( pTruthFans[i] )
                break;
        assert( i < pObj->nFans );
        return pTruthFans[i];
    }
/*
    // get the truth table of the prime node
    pTruthPrime = Kit_DsdObjTruth( pObj );
    // get storage for the temporary minterm
    pTruthMint = Vec_PtrEntry(p->vTtNodes, pNtk->nVars + pNtk->nNodes);
    // go through the minterms
    nMints = (1 << pObj->nFans);
    Kit_TruthClear( pTruthRes, pNtk->nVars );
    for ( m = 0; m < nMints; m++ )
    {
        if ( !Kit_TruthHasBit(pTruthPrime, m) )
            continue;
        Kit_TruthFill( pTruthMint, pNtk->nVars );
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            Kit_TruthAndPhase( pTruthMint, pTruthMint, pTruthFans[i], pNtk->nVars, 0, ((m & (1<<i)) == 0) ^ Abc_LitIsCompl(iLit) );
        Kit_TruthOr( pTruthRes, pTruthRes, pTruthMint, pNtk->nVars );
    }
*/
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        if ( Abc_LitIsCompl(iLit) )
            Kit_TruthNot( pTruthFans[i], pTruthFans[i], pNtk->nVars );
    pTruthTemp = Kit_TruthCompose( p->dd, Kit_DsdObjTruth(pObj), pObj->nFans, pTruthFans, pNtk->nVars, p->vTtBdds, p->vNodes );
    Kit_TruthCopy( pTruthRes, pTruthTemp, pNtk->nVars );
    return pTruthRes;
}